

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  long *plVar1;
  undefined8 node;
  long in_RSI;
  undefined1 local_50 [56];
  
  if (*(char *)(in_RSI + 0x78) == '\x01') {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  }
  else {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)local_50);
    local_50._32_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
    ;
    local_50._40_8_ = "whenWriteDisconnected";
    local_50._48_8_ = (Disposer *)0x13000001e0;
    Promise<void>::fork((Promise<void> *)(local_50 + 8));
    node = local_50._0_8_;
    if ((UnixEventPort *)local_50._0_8_ != (UnixEventPort *)0x0) {
      local_50._0_8_ = (UnixEventPort *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_50);
    if (*(char *)(in_RSI + 0x78) == '\x01') {
      *(undefined1 *)(in_RSI + 0x78) = 0;
      plVar1 = *(long **)(in_RSI + 0x88);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)(in_RSI + 0x88) = 0;
        (**(code **)**(undefined8 **)(in_RSI + 0x80))
                  (*(undefined8 **)(in_RSI + 0x80),(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
    }
    *(undefined8 *)(in_RSI + 0x80) = local_50._8_8_;
    *(undefined8 *)(in_RSI + 0x88) = local_50._16_8_;
    *(undefined1 *)(in_RSI + 0x78) = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_50._0_8_;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_SOME(p, writeDisconnectedPromise) {
      return p.addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }